

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::get_nodes_of_max_priority
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority)

{
  int iVar1;
  undefined8 in_RAX;
  Game *pGVar2;
  int *piVar3;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->cur_num_nodes != 0) {
    pGVar2 = (this->super_Solver).game;
    piVar3 = this->cur_nodes_prev + this->cur_first_node;
    uStack_28 = in_RAX;
    while( true ) {
      uStack_28 = CONCAT44(*piVar3,(undefined4)uStack_28);
      if (pGVar2->_priority[*piVar3] != max_priority) break;
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict *)((long)&uStack_28 + 4));
      pGVar2 = (this->super_Solver).game;
      piVar3 = pGVar2->_outedges + pGVar2->_firstouts[uStack_28._4_4_];
      do {
        iVar1 = *piVar3;
        if ((long)iVar1 < 0) {
          __assert_fail("*ptr2 >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/zlkpp.cpp"
                        ,0x80,"std::vector<int> pg::ZLKPPSolver::get_nodes_of_max_priority(int)");
        }
        piVar3 = piVar3 + 1;
      } while (this->cur_nodes_bm[iVar1] != true);
      this->strategy[uStack_28._4_4_] = iVar1;
      if (uStack_28._4_4_ == this->cur_first_node) {
        return __return_storage_ptr__;
      }
      piVar3 = this->cur_nodes_prev + uStack_28._4_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::get_nodes_of_max_priority(int max_priority) {
    std::vector<int> top;
    if (!cur_num_nodes)
        return top;
    int v = cur_nodes_prev[cur_first_node];
    while (priority(v) == max_priority) {
        top.push_back(v);
        const int *ptr2 = outs(v);
        for (;; ++ptr2) {
            assert(*ptr2 >= 0);
            if (cur_nodes_bm[*ptr2])
                break;
        }
        strategy[v] = *ptr2; // we can go to an arbitrary node that is currently in the game
        if (v == cur_first_node)
            break;
        v = cur_nodes_prev[v];
    }
    return top; // the returned vector is sorted
}